

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

void Gia_ManArePrintReport(Gia_ManAre_t *p,abctime Time,int fFinal)

{
  uint iState;
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *format;
  int iVar5;
  timespec local_40;
  double local_30;
  
  iState = p->iStaCur;
  uVar1 = p->nStas;
  local_30 = (double)(int)iState / (double)(int)uVar1;
  uVar2 = Gia_ManAreDepth(p,iState);
  iVar5 = 0xa333b2;
  printf("States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ",local_30,
         ((double)p->nObjPages * 16.0 * 1048576.0 +
         (double)p->nSize * (double)p->nStaPages * 4.0 * 1048576.0 +
         (double)p->pAig->nRegs * 4.0 + 200.0 + 16384.0) * 9.5367431640625e-07,(ulong)iState,
         (ulong)uVar1,(ulong)uVar2);
  Abc_Print(iVar5,"%s =","Time");
  iVar5 = 3;
  if (fFinal == 0) {
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    format = "%9.2f sec\r";
  }
  else {
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    format = "%9.2f sec\n";
  }
  Abc_Print(iVar5,format,(double)(lVar4 - Time) / 1000000.0);
  return;
}

Assistant:

void Gia_ManArePrintReport( Gia_ManAre_t * p, abctime Time, int fFinal )
{
    printf( "States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ", 
        p->iStaCur, p->nStas, 1.0*p->iStaCur/p->nStas, Gia_ManAreDepth(p, p->iStaCur), 
        (sizeof(Gia_ManAre_t) + 4.0*Gia_ManRegNum(p->pAig) + 8.0*MAX_PAGE_NUM + 
         4.0*p->nStaPages*p->nSize*MAX_ITEM_NUM + 16.0*p->nObjPages*MAX_ITEM_NUM)/(1<<20) );
    if ( fFinal )
    {
        ABC_PRT( "Time", Abc_Clock() - Time );
    }
    else
    {
        ABC_PRTr( "Time", Abc_Clock() - Time );
    }
}